

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::BaseDictionary(BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *this,BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *other)

{
  Type *addr;
  uint uVar1;
  code *pcVar2;
  Type TVar3;
  Type TVar4;
  Type TVar5;
  bool bVar6;
  DictionaryStats *pDVar7;
  undefined4 *puVar8;
  int *piVar9;
  EntryType *pEVar10;
  
  (this->buckets).ptr = (int *)0x0;
  (this->entries).ptr =
       (SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
        *)0x0;
  this->alloc = other->alloc;
  if (other->count == other->freeCount) {
    this->size = 0;
    this->bucketCount = 0;
    this->count = 0;
    this->freeCount = 0;
    this->modFunctionIndex = 0x4b;
    (this->buckets).ptr = (int *)0x0;
    (this->entries).ptr =
         (SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
          *)0x0;
    pDVar7 = (DictionaryStats *)0x0;
  }
  else {
    if (other->bucketCount == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xad,"(other.bucketCount != 0)","other.bucketCount != 0");
      if (!bVar6) goto LAB_00da90de;
      *puVar8 = 0;
    }
    if (other->size == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xae,"(other.size != 0)","other.size != 0");
      if (!bVar6) goto LAB_00da90de;
      *puVar8 = 0;
    }
    piVar9 = AllocateBuckets(this,other->bucketCount);
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = piVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    if ((this->buckets).ptr == (int *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xb1,"(buckets)","buckets");
      if (!bVar6) goto LAB_00da90de;
      *puVar8 = 0;
    }
    pEVar10 = AllocateEntries(this,other->size,false);
    addr = &this->entries;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pEVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    if (addr->ptr ==
        (SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Js::DictionaryPropertyDescriptor<unsigned_short>_>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0xb6,"(entries)","entries");
      if (!bVar6) {
LAB_00da90de:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    uVar1 = other->bucketCount;
    TVar3 = other->bucketCount;
    TVar4 = other->count;
    TVar5 = other->freeList;
    this->size = other->size;
    this->bucketCount = TVar3;
    this->count = TVar4;
    this->freeList = TVar5;
    TVar4 = other->modFunctionIndex;
    this->freeCount = other->freeCount;
    this->modFunctionIndex = TVar4;
    Memory::CopyArray<int,int,Memory::Recycler>
              ((this->buckets).ptr,(ulong)uVar1,(other->buckets).ptr,(ulong)uVar1);
    Memory::
    CopyArray<JsUtil::SimpleDictionaryEntry<Memory::WriteBarrierPtr<Js::PropertyRecord_const>,Js::DictionaryPropertyDescriptor<unsigned_short>>,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator>
              ((this->entries).ptr,(long)this->size,(other->entries).ptr,(long)this->size);
    pDVar7 = DictionaryStats::Create
                       ("PN6JsUtil14BaseDictionaryIPKN2Js14PropertyRecordENS1_28DictionaryPropertyDescriptorItEEN6Memory24RecyclerNonLeafAllocatorE20DictionarySizePolicyI14PowerOf2PolicyLj1ELj2ELj1ELj4EENS1_32PropertyRecordStringHashComparerENS_21SimpleDictionaryEntryENS_12NoResizeLockEEE"
                        ,this->size);
  }
  this->stats = pDVar7;
  return;
}

Assistant:

BaseDictionary(const BaseDictionary &other) :
          alloc(other.alloc)
        {
            if(other.Count() == 0)
            {
                size = 0;
                bucketCount = 0;
                buckets = nullptr;
                entries = nullptr;
                count = 0;
                freeCount = 0;
                modFunctionIndex = UNKNOWN_MOD_INDEX;

#if PROFILE_DICTIONARY
                stats = nullptr;
#endif
                return;
            }

            Assert(other.bucketCount != 0);
            Assert(other.size != 0);

            buckets = AllocateBuckets(other.bucketCount);
            Assert(buckets); // no-throw allocators are currently not supported

            try
            {
                entries = AllocateEntries(other.size, false /* zeroAllocate */);
                Assert(entries); // no-throw allocators are currently not supported
            }
            catch(...)
            {
                DeleteBuckets(buckets, other.bucketCount);
                throw;
            }

            size = other.size;
            bucketCount = other.bucketCount;
            count = other.count;
            freeList = other.freeList;
            freeCount = other.freeCount;
            modFunctionIndex = other.modFunctionIndex;

            CopyArray(buckets, bucketCount, other.buckets, bucketCount);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                entries, size, other.entries, size);

#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }